

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.h
# Opt level: O0

float OpenSteer::clamp<float>(float *valueToClamp,float *minValue,float *maxValue)

{
  float *maxValue_local;
  float *minValue_local;
  float *valueToClamp_local;
  undefined4 local_4;
  
  if (*minValue <= *valueToClamp) {
    if (*valueToClamp < *maxValue || *valueToClamp == *maxValue) {
      local_4 = *valueToClamp;
    }
    else {
      local_4 = *maxValue;
    }
  }
  else {
    local_4 = *minValue;
  }
  return local_4;
}

Assistant:

T
    clamp( T const& valueToClamp, T const& minValue, T const& maxValue) {
        assert( minValue <= maxValue && "minValue must be lesser or equal to maxValue."  );
        
        if ( valueToClamp < minValue ) {
            return minValue;
        } else if ( valueToClamp > maxValue ) {
            return maxValue;
        }
        
        return valueToClamp;
    }